

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

bool __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::matrix4d>(Attribute *this,matrix4d *v)

{
  value_type *pvVar1;
  long lVar2;
  long lVar3;
  storage_t<tinyusdz::value::matrix4d> *psVar4;
  storage_t<tinyusdz::value::matrix4d> *psVar5;
  byte bVar6;
  optional<tinyusdz::value::matrix4d> ret;
  optional<tinyusdz::value::matrix4d> local_a0;
  
  bVar6 = 0;
  if (v == (matrix4d *)0x0) {
    local_a0.has_value_ = false;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::matrix4d>(&local_a0,&this->_var);
    ret.has_value_ = local_a0.has_value_;
    if (local_a0.has_value_ != false) {
      lVar3 = 0x10;
      psVar4 = &local_a0.contained;
      psVar5 = &ret.contained;
      for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined8 *)psVar5 = *(undefined8 *)psVar4;
        psVar4 = (storage_t<tinyusdz::value::matrix4d> *)
                 ((long)psVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        psVar5 = (storage_t<tinyusdz::value::matrix4d> *)((long)psVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      pvVar1 = nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::value(&ret);
      for (; lVar3 != 0; lVar3 = lVar3 + -1) {
        v->m[0][0] = pvVar1->m[0][0];
        pvVar1 = (value_type *)((long)pvVar1 + ((ulong)bVar6 * -2 + 1) * 8);
        v = (matrix4d *)((long)v + ((ulong)bVar6 * -2 + 1) * 8);
      }
    }
  }
  return local_a0.has_value_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }